

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O2

void ddFixLimits(DdManager *unique)

{
  undefined8 *puVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  DdCache *__ptr;
  DdCache *pDVar5;
  DdNode *pDVar6;
  double dVar7;
  DdNode *pDVar8;
  _func_void_long *p_Var9;
  DdCache *pDVar10;
  int iVar11;
  int iVar12;
  long lVar14;
  uint uVar15;
  uint uVar13;
  
  uVar4 = unique->slots;
  unique->minDead = (uint)(long)((double)uVar4 * unique->gcFrac);
  uVar13 = unique->maxCacheHard;
  if (uVar4 * 4 < unique->maxCacheHard) {
    uVar13 = uVar4 * 4;
  }
  iVar12 = uVar13 + unique->cacheSlots * -2;
  unique->cacheSlack = iVar12;
  if (iVar12 < 0 || uVar4 >> 1 <= unique->cacheSlots) {
    return;
  }
  __ptr = unique->acache;
  pDVar5 = unique->cache;
  uVar4 = unique->cacheSlots;
  uVar13 = uVar4 * 2;
  unique->cacheSlots = uVar13;
  p_Var9 = Extra_UtilMMoutOfMemory;
  pDVar10 = (DdCache *)malloc((ulong)(uVar4 * 2 + 2) * 0x28);
  unique->acache = pDVar10;
  Extra_UtilMMoutOfMemory = p_Var9;
  if (pDVar10 == (DdCache *)0x0) {
    unique->cacheSlots = uVar4;
    unique->acache = __ptr;
    unique->maxCacheHard = uVar4 - 1;
    unique->cacheSlack = ~uVar4;
  }
  else {
    pDVar10 = (DdCache *)((long)&pDVar10->f + (ulong)(0x20 - ((uint)pDVar10 & 0x1f) & 0xfffffff8));
    unique->cache = pDVar10;
    if (((ulong)pDVar10 & 0x1f) != 0) {
      __assert_fail("((ptruint) table->cache & (32 - 1)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/cudd/cuddCache.c"
                    ,0x3da,"void cuddCacheResize(DdManager *)");
    }
    iVar12 = unique->cacheShift + -1;
    unique->cacheShift = iVar12;
    unique->memused = unique->memused + (ulong)uVar4 * 0x28;
    unique->cacheSlack = unique->cacheSlack + uVar4 * -2;
    for (lVar14 = 0; (ulong)uVar13 * 0x28 - lVar14 != 0; lVar14 = lVar14 + 0x28) {
      puVar1 = (undefined8 *)((long)&pDVar10->h + lVar14);
      *puVar1 = 0;
      puVar1[1] = 0;
    }
    iVar11 = 0;
    for (lVar14 = 0; (ulong)uVar4 * 0x28 - lVar14 != 0; lVar14 = lVar14 + 0x28) {
      pDVar6 = *(DdNode **)((long)&pDVar5->data + lVar14);
      if (pDVar6 != (DdNode *)0x0) {
        uVar3 = *(uint *)((long)&pDVar5->hash + lVar14);
        uVar15 = uVar3 >> ((byte)iVar12 & 0x1f);
        puVar1 = (undefined8 *)((long)&pDVar5->f + lVar14);
        pDVar8 = (DdNode *)puVar1[1];
        pDVar10[(int)uVar15].f = (DdNode *)*puVar1;
        pDVar10[(int)uVar15].g = pDVar8;
        pDVar10[(int)uVar15].h = *(ptruint *)((long)&pDVar5->h + lVar14);
        pDVar10[(int)uVar15].data = pDVar6;
        pDVar10[(int)uVar15].hash = uVar3;
        iVar11 = iVar11 + 1;
      }
    }
    free(__ptr);
    dVar7 = (double)(int)((double)uVar13 * unique->minHit + 1.0);
    dVar2 = unique->cacheMisses;
    unique->cacheMisses = dVar7;
    unique->totCachehits = unique->cacheHits + unique->totCachehits;
    unique->totCacheMisses = (dVar2 - dVar7) + unique->totCacheMisses;
    unique->cacheHits = 0.0;
    unique->cacheLastInserts = unique->cacheinserts - (double)iVar11;
  }
  return;
}

Assistant:

DD_INLINE
static void
ddFixLimits(
  DdManager *unique)
{
    unique->minDead = (unsigned) (unique->gcFrac * (double) unique->slots);
    unique->cacheSlack = (int) ddMin(unique->maxCacheHard,
        DD_MAX_CACHE_TO_SLOTS_RATIO * unique->slots) -
        2 * (int) unique->cacheSlots;
    if (unique->cacheSlots < unique->slots/2 && unique->cacheSlack >= 0)
        cuddCacheResize(unique);
    return;

}